

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O0

void __thiscall libchars::command_node::command_node(command_node *this)

{
  command_node *this_local;
  
  std::__cxx11::string::string((string *)this);
  this->mask = 0;
  this->hidden = false;
  this->cmd = (command *)0x0;
  this->head = (command_node *)0x0;
  this->tail = (command_node *)0x0;
  this->next = (command_node *)0x0;
  this->start = (command_node *)0x0;
  return;
}

Assistant:

command_node::command_node() :
        mask(0),hidden(false),cmd(NULL),
        head(NULL),tail(NULL),
        next(NULL),start(NULL) {}